

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::initSlice(HEkkDual *this,HighsInt initial_num_slice)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  vector<int,_std::allocator<int>_> sliced_Astart;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar6 = 1;
  if (1 < initial_num_slice) {
    uVar6 = (ulong)(uint)initial_num_slice;
  }
  this->slice_num = (HighsInt)uVar6;
  if (8 < initial_num_slice) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                "WARNING: %d = slice_num > kHighsSlicedLimit = %d so truncating slice_num\n",uVar6,8
               );
    this->slice_num = 8;
  }
  piVar5 = (this->a_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->solver_num_col;
  iVar2 = piVar5[iVar1];
  iVar3 = this->slice_num;
  iVar12 = 1;
  if (1 < iVar3) {
    iVar12 = iVar3;
  }
  this->slice_start[0] = 0;
  uVar6 = 0;
  do {
    uVar8 = uVar6;
    if (uVar8 == iVar12 - 1) goto LAB_00350db3;
    uVar6 = (ulong)this->slice_start[uVar8];
    piVar10 = piVar5 + uVar6 + 1;
    do {
      uVar9 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar9;
      iVar4 = *piVar10;
      piVar10 = piVar10 + 1;
    } while (iVar4 < (int)((double)(int)(uVar8 + 1) * ((double)iVar2 / (double)iVar3)));
    this->slice_start[uVar8 + 1] = uVar9;
    uVar6 = uVar8 + 1;
  } while ((int)uVar9 < iVar1);
  this->slice_num = (HighsInt)uVar8;
LAB_00350db3:
  this->slice_start[this->slice_num] = iVar1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar7 = 0; lVar7 < this->slice_num; lVar7 = lVar7 + 1) {
    iVar1 = this->slice_start[lVar7];
    lVar11 = (long)iVar1;
    iVar2 = this->slice_start[lVar7 + 1];
    iVar3 = piVar5[lVar11];
    std::vector<int,_std::allocator<int>_>::resize(&local_48,(iVar2 - lVar11) + 1);
    iVar12 = (int)(iVar2 - lVar11);
    if (-1 < iVar12) {
      uVar6 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] = piVar5[lVar11 + uVar6] - iVar3;
        uVar6 = uVar6 + 1;
      } while ((iVar2 - iVar1) + 1 != uVar6);
    }
    HighsSparseMatrix::createSlice
              (this->slice_a_matrix + lVar7,&(this->ekk_instance_->lp_).a_matrix_,iVar1,iVar2 + -1);
    HighsSparseMatrix::createRowwise(this->slice_ar_matrix + lVar7,this->slice_a_matrix + lVar7);
    HVectorBase<double>::setup(this->slice_row_ap + lVar7,iVar12);
    HEkkDualRow::setupSlice
              ((this->slice_dualRow).super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar7,iVar12);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HEkkDual::initSlice(const HighsInt initial_num_slice) {
  // Number of slices
  slice_num = initial_num_slice;
  if (slice_num < 1) slice_num = 1;
  assert(slice_num <= kHighsSlicedLimit);
  if (slice_num > kHighsSlicedLimit) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                "WARNING: %" HIGHSINT_FORMAT
                " = slice_num > kHighsSlicedLimit = %" HIGHSINT_FORMAT
                " so truncating "
                "slice_num\n",
                slice_num, kHighsSlicedLimit);
    slice_num = kHighsSlicedLimit;
  }

  // Alias to the matrix
  const HighsInt* Astart = a_matrix->start_.data();
  const HighsInt AcountX = Astart[solver_num_col];

  // Figure out partition weight
  double sliced_countX = AcountX / (double)slice_num;
  slice_start[0] = 0;
  for (HighsInt i = 0; i < slice_num - 1; i++) {
    HighsInt endColumn = slice_start[i] + 1;  // At least one column
    HighsInt endX = Astart[endColumn];
    HighsInt stopX = (i + 1) * sliced_countX;
    while (endX < stopX) {
      endX = Astart[++endColumn];
    }
    slice_start[i + 1] = endColumn;
    if (endColumn >= solver_num_col) {
      slice_num = i;  // SHRINK
      break;
    }
  }
  slice_start[slice_num] = solver_num_col;

  // Partition the matrix, row_ap and related packet
  vector<HighsInt> sliced_Astart;
  for (HighsInt i = 0; i < slice_num; i++) {
    // The matrix
    HighsInt from_col = slice_start[i];
    HighsInt to_col = slice_start[i + 1] - 1;
    HighsInt slice_num_col = slice_start[i + 1] - from_col;
    HighsInt from_el = Astart[from_col];
    sliced_Astart.resize(slice_num_col + 1);
    for (HighsInt k = 0; k <= slice_num_col; k++)
      sliced_Astart[k] = Astart[k + from_col] - from_el;
    slice_a_matrix[i].createSlice(ekk_instance_.lp_.a_matrix_, from_col,
                                  to_col);
    slice_ar_matrix[i].createRowwise(slice_a_matrix[i]);

    // The row_ap and its packages
    slice_row_ap[i].setup(slice_num_col);
    slice_dualRow[i].setupSlice(slice_num_col);
  }
}